

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

void __thiscall ieee754::set_raw_exp(ieee754 *this,int e)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  
  iVar1 = this->ebits;
  if (iVar1 < 8) {
    bVar2 = (byte)(0xff << (7U - (char)iVar1 & 0x1f)) & 0x7f;
    cVar3 = '\a';
    lVar4 = -1;
  }
  else {
    if (0xf < iVar1) {
      return;
    }
    this->buf[(long)this->bytes + -1] = this->buf[(long)this->bytes + -1] & 0x80;
    this->buf[(long)this->bytes + -1] =
         this->buf[(long)this->bytes + -1] | (byte)(e >> ((char)this->ebits - 7U & 0x1f)) & 0x7f;
    bVar2 = (byte)(0xff << (0xfU - (char)this->ebits & 0x1f));
    cVar3 = '\x0f';
    lVar4 = -2;
  }
  this->buf[lVar4 + this->bytes] = this->buf[lVar4 + this->bytes] & ~bVar2;
  this->buf[lVar4 + this->bytes] =
       this->buf[lVar4 + this->bytes] | (byte)(e << (cVar3 - (char)this->ebits & 0x1fU)) & bVar2;
  return;
}

Assistant:

void set_raw_exp(int e)
    {
        int mask;
        if (ebits <= 7)
        {
            /* it fits entirely in the first byte */
            mask = (0xff << (7 - ebits)) & 0x7f;
            buf[bytes-1] &= ~mask;
            buf[bytes-1] |= (e << (7 - ebits)) & mask;
        }
        else if (ebits <= 15)
        {
            /* it fits in the first two bytes */
            buf[bytes-1] &= 0x80;
            buf[bytes-1] |= (e >> (ebits - 7)) & 0x7f;
            
            mask = (0xff << (15 - ebits)) & 0xff;
            buf[bytes-2] &= ~mask;
            buf[bytes-2] |= (e << (15 - ebits)) & mask;
        }
        else
        {
            /* we don't currently handle anything above quad precision */
            assert(FALSE);
        }
    }